

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O2

BatchedChunkIteratorRange __thiscall
duckdb::BatchedDataCollection::BatchRange(BatchedDataCollection *this,idx_t begin_idx,idx_t end_idx)

{
  ulong uVar1;
  batch_iterator_t bVar2;
  difference_type __d_1;
  BatchedChunkIteratorRange BVar3;
  _Base_ptr local_20;
  
  uVar1 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_20 = (_Base_ptr)0x0;
  bVar2._M_node = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ::std::
  __advance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,long>
            ();
  if ((end_idx == 0xffffffffffffffff) || (uVar1 < end_idx)) {
    local_20 = &(this->data)._M_t._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_20 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    ::std::
    __advance<std::_Rb_tree_iterator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,long>
              (&local_20,end_idx);
  }
  BVar3.end._M_node = local_20;
  BVar3.begin._M_node = bVar2._M_node;
  return BVar3;
}

Assistant:

BatchedChunkIteratorRange BatchedDataCollection::BatchRange(idx_t begin_idx, idx_t end_idx) {
	D_ASSERT(begin_idx < end_idx);
	if (end_idx > data.size()) {
		// Limit the iterator to the end
		end_idx = DConstants::INVALID_INDEX;
	}
	BatchedChunkIteratorRange range;
	range.begin = data.begin();
	std::advance(range.begin, begin_idx);
	if (end_idx == DConstants::INVALID_INDEX) {
		range.end = data.end();
	} else {
		range.end = data.begin();
		std::advance(range.end, end_idx);
	}
	return range;
}